

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O3

int av1_get_mvpred_sse(MV_COST_PARAMS *mv_cost_params,FULLPEL_MV best_mv,aom_variance_fn_ptr_t *vfp,
                      buf_2d *src,buf_2d *pre)

{
  MV_COST_TYPE MVar1;
  short sVar2;
  ushort uVar3;
  short sVar4;
  ushort uVar5;
  int iVar6;
  undefined8 in_RAX;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  uint sse;
  uint local_24;
  
  local_24 = (uint)((ulong)in_RAX >> 0x20);
  (*vfp->vf)(src->buf,src->stride,
             pre->buf + (((int)best_mv >> 0x10) + (int)best_mv.row * pre->stride),pre->stride,
             &local_24);
  MVar1 = mv_cost_params->mv_cost_type;
  iVar6 = 0;
  if (MVar1 != '\x04') {
    uVar5 = (ushort)((uint)best_mv >> 0xd) & 0xfff8;
    sVar4 = best_mv.row * 8;
    sVar2 = mv_cost_params->ref_mv->row;
    uVar3 = mv_cost_params->ref_mv->col;
    sVar9 = sVar4 - sVar2;
    sVar7 = uVar5 - uVar3;
    sVar10 = -sVar9;
    if (0 < sVar9) {
      sVar10 = sVar9;
    }
    sVar8 = -sVar7;
    if (0 < sVar7) {
      sVar8 = sVar7;
    }
    if (MVar1 == '\x03') {
      iVar6 = (int)sVar8 + (int)sVar10 >> 3;
    }
    else if (MVar1 == '\x01') {
      iVar6 = (int)sVar8 + (int)sVar10 >> 2;
    }
    else if (MVar1 == '\0') {
      iVar6 = (int)(((long)mv_cost_params->mvcost[1][sVar7] + (long)mv_cost_params->mvcost[0][sVar9]
                    + (long)*(int *)((long)mv_cost_params->mvjcost +
                                    (ulong)((uint)(uVar5 != uVar3) * 4 + (uint)(sVar4 != sVar2) * 8)
                                    )) * (long)mv_cost_params->error_per_bit + 0x2000U >> 0xe);
    }
  }
  return iVar6 + local_24;
}

Assistant:

int av1_get_mvpred_sse(const MV_COST_PARAMS *mv_cost_params,
                       const FULLPEL_MV best_mv,
                       const aom_variance_fn_ptr_t *vfp,
                       const struct buf_2d *src, const struct buf_2d *pre) {
  const MV mv = get_mv_from_fullmv(&best_mv);
  unsigned int sse, var;

  var = vfp->vf(src->buf, src->stride, get_buf_from_fullmv(pre, &best_mv),
                pre->stride, &sse);
  (void)var;

  return sse + mv_err_cost_(&mv, mv_cost_params);
}